

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void scm_resize(int64_t w,int64_t h)

{
  cell_map local_30;
  
  scm_stop();
  if (0 < w) {
    width = (int)w;
  }
  if (0 < h) {
    height = (int)h;
  }
  cell_map::cell_map(&local_30,width,height);
  grid.width = local_30.width;
  grid.height = local_30.height;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&grid.cells,&local_30.cells);
  if (local_30.cells.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.cells.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.cells.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.cells.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  paint_grid();
  return;
}

Assistant:

void scm_resize(int64_t w, int64_t h)
  {
  scm_stop();
  if (w > 0)
    width = (int)w;
  if (h > 0)
    height = (int)h;
  grid = cell_map(width, height);
  paint_grid();
  }